

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O0

bool __thiscall clickhouse::Client::Impl::ReceiveException(Impl *this,bool rethrow)

{
  long *plVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  bool bVar6;
  type pEVar7;
  unique_ptr<clickhouse::Exception,_std::default_delete<clickhouse::Exception>_> *this_00;
  byte in_SIL;
  ServerException *in_RDI;
  bool has_nested;
  Exception *current;
  unique_ptr<clickhouse::Exception,_std::default_delete<clickhouse::Exception>_> e;
  pointer in_stack_ffffffffffffff58;
  Exception *in_stack_ffffffffffffff60;
  CodedInputStream *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 uVar8;
  bool local_1;
  
  operator_new(0x70);
  Exception::Exception(in_stack_ffffffffffffff60);
  std::unique_ptr<clickhouse::Exception,std::default_delete<clickhouse::Exception>>::
  unique_ptr<std::default_delete<clickhouse::Exception>,void>
            ((unique_ptr<clickhouse::Exception,_std::default_delete<clickhouse::Exception>_> *)
             in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  std::unique_ptr<clickhouse::Exception,_std::default_delete<clickhouse::Exception>_>::get
            ((unique_ptr<clickhouse::Exception,_std::default_delete<clickhouse::Exception>_> *)
             in_stack_ffffffffffffff60);
  uVar2 = WireFormat::ReadFixed<int>
                    ((CodedInputStream *)in_stack_ffffffffffffff60,&in_stack_ffffffffffffff58->code)
  ;
  if ((bool)uVar2) {
    uVar3 = WireFormat::ReadString(in_stack_ffffffffffffff68,(string *)in_stack_ffffffffffffff60);
    if ((bool)uVar3) {
      uVar4 = WireFormat::ReadString(in_stack_ffffffffffffff68,(string *)in_stack_ffffffffffffff60);
      if ((bool)uVar4) {
        uVar5 = WireFormat::ReadString
                          (in_stack_ffffffffffffff68,(string *)in_stack_ffffffffffffff60);
        if ((bool)uVar5) {
          bVar6 = WireFormat::ReadFixed<bool>
                            ((CodedInputStream *)in_stack_ffffffffffffff60,
                             (bool *)in_stack_ffffffffffffff58);
          uVar8 = CONCAT13(bVar6,(int3)in_stack_ffffffffffffff98);
          if (bVar6) {
            if (*(long *)&in_RDI[8].field_0x8 != 0) {
              plVar1 = *(long **)&in_RDI[8].field_0x8;
              pEVar7 = std::
                       unique_ptr<clickhouse::Exception,_std::default_delete<clickhouse::Exception>_>
                       ::operator*((unique_ptr<clickhouse::Exception,_std::default_delete<clickhouse::Exception>_>
                                    *)in_stack_ffffffffffffff60);
              (**(code **)(*plVar1 + 0x28))(plVar1,pEVar7);
            }
            if (((in_SIL & 1) != 0) ||
               (((ulong)in_RDI[5].exception_._M_t.
                        super___uniq_ptr_impl<clickhouse::Exception,_std::default_delete<clickhouse::Exception>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_clickhouse::Exception_*,_std::default_delete<clickhouse::Exception>_>
                        .super__Head_base<0UL,_clickhouse::Exception_*,_false>._M_head_impl & 1) !=
                0)) {
              this_00 = (unique_ptr<clickhouse::Exception,_std::default_delete<clickhouse::Exception>_>
                         *)__cxa_allocate_exception(0x18);
              std::unique_ptr<clickhouse::Exception,_std::default_delete<clickhouse::Exception>_>::
              unique_ptr(this_00,(unique_ptr<clickhouse::Exception,_std::default_delete<clickhouse::Exception>_>
                                  *)in_stack_ffffffffffffff58);
              ServerException::ServerException
                        (in_RDI,(unique_ptr<clickhouse::Exception,_std::default_delete<clickhouse::Exception>_>
                                 *)CONCAT17(uVar2,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,uVar8
                                                                                        )))));
              __cxa_throw(this_00,&ServerException::typeinfo,ServerException::~ServerException);
            }
            local_1 = true;
          }
          else {
            local_1 = false;
          }
        }
        else {
          local_1 = false;
        }
      }
      else {
        local_1 = false;
      }
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  std::unique_ptr<clickhouse::Exception,_std::default_delete<clickhouse::Exception>_>::~unique_ptr
            ((unique_ptr<clickhouse::Exception,_std::default_delete<clickhouse::Exception>_> *)
             in_stack_ffffffffffffff60);
  return local_1;
}

Assistant:

bool Client::Impl::ReceiveException(bool rethrow) {
    std::unique_ptr<Exception> e(new Exception);
    Exception* current = e.get();

    do {
        bool has_nested = false;

        if (!WireFormat::ReadFixed(&input_, &current->code)) {
            return false;
        }
        if (!WireFormat::ReadString(&input_, &current->name)) {
            return false;
        }
        if (!WireFormat::ReadString(&input_, &current->display_text)) {
            return false;
        }
        if (!WireFormat::ReadString(&input_, &current->stack_trace)) {
            return false;
        }
        if (!WireFormat::ReadFixed(&input_, &has_nested)) {
            return false;
        }

        if (has_nested) {
            current->nested.reset(new Exception);
            current = current->nested.get();
        } else {
            break;
        }
    } while (true);

    if (events_) {
        events_->OnServerException(*e);
    }

    if (rethrow || options_.rethrow_exceptions) {
        throw ServerException(std::move(e));
    }

    return true;
}